

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O1

ON_3dPoint * __thiscall
ON_BoundingBox::FarPoint
          (ON_3dPoint *__return_storage_ptr__,ON_BoundingBox *this,ON_3dPoint *test_point)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  
  __return_storage_ptr__->z = test_point->z;
  dVar1 = test_point->y;
  __return_storage_ptr__->x = test_point->x;
  __return_storage_ptr__->y = dVar1;
  dVar1 = (this->m_min).x;
  dVar2 = (this->m_max).x;
  uVar3 = -(ulong)(ABS(dVar1 - test_point->x) < ABS(dVar2 - test_point->x));
  __return_storage_ptr__->x = (double)(~uVar3 & (ulong)dVar1 | (ulong)dVar2 & uVar3);
  dVar1 = (this->m_min).y;
  dVar2 = (this->m_max).y;
  uVar3 = -(ulong)(ABS(dVar1 - test_point->y) < ABS(dVar2 - test_point->y));
  __return_storage_ptr__->y = (double)(~uVar3 & (ulong)dVar1 | (ulong)dVar2 & uVar3);
  dVar1 = (this->m_min).z;
  dVar2 = (this->m_max).z;
  uVar3 = -(ulong)(ABS(dVar1 - test_point->z) < ABS(dVar2 - test_point->z));
  __return_storage_ptr__->z = (double)(~uVar3 & (ulong)dVar1 | (ulong)dVar2 & uVar3);
  return __return_storage_ptr__;
}

Assistant:

ON_3dPoint ON_BoundingBox::FarPoint( 
  const ON_3dPoint& test_point
  ) const
{
  ON_3dPoint far_point = test_point;
 // if ( IsValid() ) {
    far_point.x = ( fabs(m_min.x-test_point.x) >= fabs(m_max.x-test_point.x) )
                ? m_min.x : m_max.x;
    far_point.y = ( fabs(m_min.y-test_point.y) >= fabs(m_max.y-test_point.y) )
                ? m_min.y : m_max.y;
    far_point.z = ( fabs(m_min.z-test_point.z) >= fabs(m_max.z-test_point.z) )
                ? m_min.z : m_max.z;
//  }
  return far_point;
}